

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

node_t binop(int id,node_t left,node_t right)

{
  _node_t *to;
  int in_EDI;
  _node_t *new;
  _node_t *in_stack_ffffffffffffffd8;
  
  to = create_node();
  to->id = in_EDI;
  if (in_EDI == 0x3d) {
    to->type = ASSIGN;
  }
  else {
    to->type = BINOP;
  }
  add_child(to,in_stack_ffffffffffffffd8);
  add_child(to,in_stack_ffffffffffffffd8);
  return to;
}

Assistant:

node_t binop(int id, node_t left, node_t right)
{
    _node_t* new = create_node();
    new->id = id;
    if (id == '=')
        new->type = ASSIGN;
    else
        new->type = BINOP;
    add_child(new, (_node_t*)left);
    add_child(new, (_node_t*)right);
    return (node_t)new;
}